

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

void __thiscall FFlatVertexBuffer::CreateVBO(FFlatVertexBuffer *this)

{
  uint uVar1;
  
  TArray<FFlatVertex,_FFlatVertex>::Resize(&this->vbo_shadowdata,this->mNumReserved);
  CreateFlatVBO(this);
  uVar1 = (this->vbo_shadowdata).Count;
  this->mIndex = uVar1;
  this->mCurIndex = uVar1;
  Map(this);
  memcpy(this->map,(this->vbo_shadowdata).Array,(ulong)(this->vbo_shadowdata).Count * 0x14);
  Unmap(this);
  return;
}

Assistant:

void FFlatVertexBuffer::CreateVBO()
{
	vbo_shadowdata.Resize(mNumReserved);
	CreateFlatVBO();
	mCurIndex = mIndex = vbo_shadowdata.Size();
	Map();
	memcpy(map, &vbo_shadowdata[0], vbo_shadowdata.Size() * sizeof(FFlatVertex));
	Unmap();
}